

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dump.cc
# Opt level: O1

ostream * pstack::operator<<(ostream *os,JSON<pstack::Elf::Object,_char> *elf)

{
  byte bVar1;
  Object *pOVar2;
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  MVar3;
  int iVar4;
  JObject *pJVar5;
  SymbolVersioning *v;
  Notes local_78;
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  local_70;
  Mapper<pstack::ProgramHeaderName,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>_>
  mappedSegments;
  JObject writer;
  string local_50;
  char local_2e [6];
  
  pOVar2 = elf->object;
  bVar1 = (pOVar2->elfHeader).e_ident[7];
  local_70.container = &pOVar2->programHeaders;
  writer.os = (ostream *)0x169c30;
  mappedSegments.container =
       (map<unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<Elf64_Phdr,_std::allocator<Elf64_Phdr>_>_>_>_>
        *)os;
  std::__ostream_insert<char,std::char_traits<char>>(os,"{ ",2);
  local_2e[0] = '\0';
  pJVar5 = JObject::field<char[5],char_const*,char>
                     ((JObject *)&mappedSegments,(char (*) [5])0x168c2c,
                      operator<<::typeNames + (pOVar2->elfHeader).e_type,local_2e);
  local_2e[1] = 0;
  pJVar5 = JObject::field<char[6],unsigned_long,char>
                     (pJVar5,(char (*) [6])0x165d50,&(pOVar2->elfHeader).e_entry,local_2e + 1);
  if (bVar1 < 0xd) {
    local_50._M_dataplus._M_p =
         _ZZN6pstacklsERSoRKNS_4JSONINS_3Elf6ObjectEcEEE8abiNames_rel +
         *(int *)(_ZZN6pstacklsERSoRKNS_4JSONINS_3Elf6ObjectEcEEE8abiNames_rel + (ulong)bVar1 * 4);
  }
  else {
    local_50._M_dataplus._M_p = (pointer)0x0;
  }
  local_2e[2] = 0;
  pJVar5 = JObject::field<char[4],char_const*,char>
                     (pJVar5,(char (*) [4])"abi",(char **)&local_50,local_2e + 2);
  local_2e[3] = 0;
  pJVar5 = JObject::
           field<char[9],std::vector<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>,std::allocator<std::unique_ptr<pstack::Elf::Section,std::default_delete<pstack::Elf::Section>>>>,char>
                     (pJVar5,(char (*) [9])"sections",&elf->object->sectionHeaders,local_2e + 3);
  writer.sep = (char *)elf->object;
  pJVar5 = JObject::
           field<char[9],pstack::Mapper<pstack::ProgramHeaderName,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::map<unsigned_int,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,std::vector<Elf64_Phdr,std::allocator<Elf64_Phdr>>>>>>,pstack::Elf::Object_const*>
                     (pJVar5,(char (*) [9])"segments",&local_70,(Object **)&writer.sep);
  local_78.object = elf->object;
  local_2e[4] = 0;
  pJVar5 = JObject::field<char[6],pstack::Elf::Notes,char>
                     (pJVar5,(char (*) [6])"notes",&local_78,local_2e + 4);
  v = Elf::Object::symbolVersions(elf->object);
  local_2e[5] = 0;
  JObject::field<char[12],pstack::Elf::SymbolVersioning,char>
            (pJVar5,(char (*) [12])"versioninfo",v,local_2e + 5);
  Elf::Object::getInterpreter_abi_cxx11_(&local_50,elf->object);
  iVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    (&local_50,"");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if (iVar4 != 0) {
    Elf::Object::getInterpreter_abi_cxx11_(&local_50,elf->object);
    writer.sep = (char *)((ulong)writer.sep & 0xffffffffffffff00);
    JObject::field<char[12],std::__cxx11::string,char>
              ((JObject *)&mappedSegments,(char (*) [12])"interpreter",&local_50,(char *)&writer.sep
              );
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
  }
  MVar3.container = mappedSegments.container;
  JObject::~JObject((JObject *)&mappedSegments);
  return (ostream *)MVar3.container;
}

Assistant:

std::ostream &operator<< (std::ostream &os, const JSON<Elf::Object> &elf)
{
    static const char *typeNames[] = {
         "ET_NONE",
         "ET_REL",
         "ET_EXEC",
         "ET_DYN",
         "ET_CORE"
    };

    static const char *abiNames[] = {
        "SYSV/NONE",
        "HP-UX",
        "NetBSD",
        "Linux",
        "Hurd",
        "86Open",
        "Solaris",
        "Monterey",
        "Irix",
        "FreeBSD",
        "Tru64",
        "Modesto",
        "OpenBSD"
    };

    auto &ehdr = elf.object.getHeader();
    auto brand = ehdr.e_ident[EI_OSABI];

    Mapper<ProgramHeaderName, decltype(elf.object.programHeaders)::mapped_type,
       std::map<Elf::Word, Elf::Object::ProgramHeaders>> mappedSegments(elf.object.programHeaders);
    JObject writer(os);
    writer
        .field("type", typeNames[ehdr.e_type])
        .field("entry", ehdr.e_entry)
        .field("abi", brand < sizeof abiNames / sizeof abiNames[0]? abiNames[brand] : nullptr)
        .field("sections", elf.object.sectionHeaders)
        .field("segments", mappedSegments, &elf.object)
        .field("notes", elf.object.notes())
        .field("versioninfo", *elf.object.symbolVersions())
        ;

    if (elf.object.getInterpreter() != "")
        writer.field("interpreter", elf.object.getInterpreter());
    return writer;
}